

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_tc.c
# Opt level: O0

olsrv2_tc_edge * olsrv2_tc_edge_add(olsrv2_tc_node *src,netaddr *addr)

{
  uint8_t *puVar1;
  long lVar2;
  undefined8 *puVar3;
  olsrv2_tc_node *local_70;
  olsrv2_tc_node *local_68;
  int local_5c;
  olsrv2_tc_node *poStack_58;
  int i;
  olsrv2_tc_node *dst;
  olsrv2_tc_edge *inverse;
  olsrv2_tc_edge *edge;
  netaddr *addr_local;
  olsrv2_tc_node *src_local;
  
  lVar2 = avl_find(&src->_edges,addr);
  if (lVar2 == 0) {
    local_68 = (olsrv2_tc_node *)0x0;
  }
  else {
    local_68 = (olsrv2_tc_node *)(lVar2 + -0x30);
  }
  if (local_68 == (olsrv2_tc_node *)0x0) {
    src_local = (olsrv2_tc_node *)oonf_class_malloc(&_tc_edge_class);
    if (src_local == (olsrv2_tc_node *)0x0) {
      src_local = (olsrv2_tc_node *)0x0;
    }
    else {
      puVar3 = (undefined8 *)oonf_class_malloc(&_tc_edge_class);
      if (puVar3 == (undefined8 *)0x0) {
        oonf_class_free(&_tc_edge_class,src_local);
        src_local = (olsrv2_tc_node *)0x0;
      }
      else {
        lVar2 = avl_find(&_tc_tree,addr);
        if (lVar2 == 0) {
          local_70 = (olsrv2_tc_node *)0x0;
        }
        else {
          local_70 = (olsrv2_tc_node *)(lVar2 + -0x150);
        }
        poStack_58 = local_70;
        if ((local_70 == (olsrv2_tc_node *)0x0) &&
           (poStack_58 = olsrv2_tc_node_add(addr,0,0), poStack_58 == (olsrv2_tc_node *)0x0)) {
          oonf_class_free(&_tc_edge_class,src_local);
          oonf_class_free(&_tc_edge_class,puVar3);
          src_local = (olsrv2_tc_node *)0x0;
        }
        else {
          *(olsrv2_tc_node **)(src_local->target).prefix.dst._addr = src;
          *(olsrv2_tc_node **)((src_local->target).prefix.dst._addr + 8) = poStack_58;
          *(undefined8 **)&(src_local->target).prefix.dst._type = puVar3;
          for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
            puVar1 = (src_local->target).prefix.src._addr + (long)local_5c * 4 + 6;
            puVar1[0] = 0xff;
            puVar1[1] = 0xff;
            puVar1[2] = 0xff;
            puVar1[3] = '\0';
          }
          *(olsrv2_tc_node **)&(src_local->target)._dijkstra._node.balance = poStack_58;
          avl_insert(&src->_edges,&(src_local->target)._dijkstra._node.list.prev);
          *puVar3 = poStack_58;
          puVar3[1] = src;
          puVar3[2] = src_local;
          *(undefined1 *)((long)puVar3 + 0x2a) = 1;
          for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
            *(undefined4 *)((long)puVar3 + (long)local_5c * 4 + 0x18) = 0xffffff;
          }
          puVar3[0xb] = src;
          avl_insert(&poStack_58->_edges,puVar3 + 6);
          oonf_class_event(&_tc_edge_class,src_local,1);
        }
      }
    }
  }
  else {
    *(undefined1 *)((long)&(local_68->target)._dijkstra._node.list.next + 2) = 0;
    for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
      puVar1 = (local_68->target).prefix.src._addr + (long)local_5c * 4 + 6;
      puVar1[0] = 0xff;
      puVar1[1] = 0xff;
      puVar1[2] = 0xff;
      puVar1[3] = '\0';
    }
    oonf_class_event(&_tc_edge_class,local_68,1);
    src_local = local_68;
  }
  return (olsrv2_tc_edge *)src_local;
}

Assistant:

struct olsrv2_tc_edge *
olsrv2_tc_edge_add(struct olsrv2_tc_node *src, struct netaddr *addr) {
  struct olsrv2_tc_edge *edge = NULL, *inverse = NULL;
  struct olsrv2_tc_node *dst = NULL;
  int i;

  edge = avl_find_element(&src->_edges, addr, edge, _node);
  if (edge != NULL) {
    edge->virtual = false;

    /* cleanup metric data from other side of the edge */
    for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
      edge->cost[i] = RFC7181_METRIC_INFINITE;
    }

    /* fire event */
    oonf_class_event(&_tc_edge_class, edge, OONF_OBJECT_ADDED);
    return edge;
  }

  /* allocate edge */
  edge = oonf_class_malloc(&_tc_edge_class);
  if (edge == NULL) {
    return NULL;
  }

  /* allocate inverse edge */
  inverse = oonf_class_malloc(&_tc_edge_class);
  if (inverse == NULL) {
    oonf_class_free(&_tc_edge_class, edge);
    return NULL;
  }

  /* find or allocate destination node */
  dst = avl_find_element(&_tc_tree, addr, dst, _originator_node);
  if (dst == NULL) {
    /* create virtual node */
    dst = olsrv2_tc_node_add(addr, 0, 0);
    if (dst == NULL) {
      oonf_class_free(&_tc_edge_class, edge);
      oonf_class_free(&_tc_edge_class, inverse);
      return NULL;
    }
  }

  /* initialize edge */
  edge->src = src;
  edge->dst = dst;
  edge->inverse = inverse;
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    edge->cost[i] = RFC7181_METRIC_INFINITE;
  }

  /* hook edge into src node */
  edge->_node.key = &dst->target.prefix.dst;
  avl_insert(&src->_edges, &edge->_node);

  /* initialize inverse (virtual) edge */
  inverse->src = dst;
  inverse->dst = src;
  inverse->inverse = edge;
  inverse->virtual = true;
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    inverse->cost[i] = RFC7181_METRIC_INFINITE;
  }

  /* hook inverse edge into dst node */
  inverse->_node.key = &src->target.prefix.dst;
  avl_insert(&dst->_edges, &inverse->_node);

  /* fire event */
  oonf_class_event(&_tc_edge_class, edge, OONF_OBJECT_ADDED);
  return edge;
}